

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UBool __thiscall icu_63::AndConstraint::isFulfilled(AndConstraint *this,IFixedDecimal *number)

{
  PluralOperand PVar1;
  int32_t iVar2;
  double x;
  double dVar3;
  bool local_49;
  int local_34;
  double dStack_30;
  int32_t r;
  double n;
  PluralOperand operand;
  UBool result;
  IFixedDecimal *number_local;
  AndConstraint *this_local;
  
  if (this->digitsType == none) {
    return '\x01';
  }
  PVar1 = tokenTypeToPluralOperand(this->digitsType);
  (*number->_vptr_IFixedDecimal[2])(number,(ulong)PVar1);
  if (this->integerOnly != '\0') {
    dVar3 = uprv_floor_63(x);
    if ((x != dVar3) || (NAN(x) || NAN(dVar3))) {
      n._7_1_ = false;
      goto LAB_00319710;
    }
  }
  dStack_30 = x;
  if (this->op == MOD) {
    dStack_30 = std::fmod<double,int>(x,this->opNum);
  }
  if (this->rangeList == (UVector32 *)0x0) {
    local_49 = true;
    if (this->value != -1) {
      local_49 = dStack_30 == (double)this->value;
    }
    n._7_1_ = local_49;
  }
  else {
    n._7_1_ = false;
    for (local_34 = 0; iVar2 = UVector32::size(this->rangeList), local_34 < iVar2;
        local_34 = local_34 + 2) {
      iVar2 = UVector32::elementAti(this->rangeList,local_34);
      if (((double)iVar2 <= dStack_30) &&
         (iVar2 = UVector32::elementAti(this->rangeList,local_34 + 1), dStack_30 <= (double)iVar2))
      {
        n._7_1_ = true;
        break;
      }
    }
  }
LAB_00319710:
  if (this->negated != '\0') {
    n._7_1_ = (bool)((n._7_1_ != false ^ 0xffU) & 1);
  }
  return n._7_1_;
}

Assistant:

UBool
AndConstraint::isFulfilled(const IFixedDecimal &number) {
    UBool result = TRUE;
    if (digitsType == none) {
        // An empty AndConstraint, created by a rule with a keyword but no following expression.
        return TRUE;
    }

    PluralOperand operand = tokenTypeToPluralOperand(digitsType);
    double n = number.getPluralOperand(operand);     // pulls n | i | v | f value for the number.
                                                     // Will always be positive.
                                                     // May be non-integer (n option only)
    do {
        if (integerOnly && n != uprv_floor(n)) {
            result = FALSE;
            break;
        }

        if (op == MOD) {
            n = fmod(n, opNum);
        }
        if (rangeList == nullptr) {
            result = value == -1 ||    // empty rule
                     n == value;       //  'is' rule
            break;
        }
        result = FALSE;                // 'in' or 'within' rule
        for (int32_t r=0; r<rangeList->size(); r+=2) {
            if (rangeList->elementAti(r) <= n && n <= rangeList->elementAti(r+1)) {
                result = TRUE;
                break;
            }
        }
    } while (FALSE);

    if (negated) {
        result = !result;
    }
    return result;
}